

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter.h
# Opt level: O0

void __thiscall
spdlog::details::B_formatter::format
          (B_formatter *this,log_msg *param_2,tm *tm_time,memory_buffer *dest)

{
  string_view_t txt;
  string_view_t view;
  memory_buffer *in_RDI;
  scoped_pad p;
  string_view_t field_value;
  char *in_stack_ffffffffffffff68;
  padding_info *in_stack_ffffffffffffff78;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff88;
  size_t in_stack_ffffffffffffff90;
  undefined8 local_30;
  undefined8 uStack_28;
  
  fmt::v5::basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)in_RDI,in_stack_ffffffffffffff68);
  txt.size_ = in_stack_ffffffffffffff90;
  txt.data_ = in_stack_ffffffffffffff88;
  scoped_pad::scoped_pad
            ((scoped_pad *)in_stack_ffffffffffffff80,txt,in_stack_ffffffffffffff78,in_RDI);
  view.size_ = uStack_28;
  view.data_ = local_30;
  fmt_helper::append_string_view<500ul>(view,in_stack_ffffffffffffff80);
  scoped_pad::~scoped_pad((scoped_pad *)in_RDI);
  return;
}

Assistant:

void format(const details::log_msg &, const std::tm &tm_time, fmt::memory_buffer &dest) override
    {
        string_view_t field_value{full_months[tm_time.tm_mon]};
        scoped_pad p(field_value, padinfo_, dest);
        fmt_helper::append_string_view(field_value, dest);
    }